

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void pack_table(void)

{
  Yshort **__ptr;
  Yshort **__ptr_00;
  uint uVar1;
  Yshort YVar2;
  Yshort *pYVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  base = (Yshort *)allocate(nvectors << 2);
  pos = (Yshort *)allocate(nentries << 2);
  maxtable = 1000;
  table = (Yshort *)allocate(4000);
  pYVar3 = (Yshort *)allocate(maxtable << 2);
  lowzero = 0;
  high = 0;
  uVar5 = 0;
  uVar4 = (ulong)(uint)maxtable;
  check = pYVar3;
  if (maxtable < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pYVar3[uVar5] = -1;
  }
  iVar7 = nentries;
  for (lVar6 = 0; __ptr_00 = tos, __ptr = froms, lVar6 < iVar7; lVar6 = lVar6 + 1) {
    uVar1 = matching_vector((int)lVar6);
    if ((int)uVar1 < 0) {
      YVar2 = pack_vector((int)lVar6);
      iVar7 = nentries;
    }
    else {
      YVar2 = base[uVar1];
    }
    pYVar3 = base;
    pos[lVar6] = YVar2;
    pYVar3[order[lVar6]] = YVar2;
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)nvectors;
  if (nvectors < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    free(__ptr[uVar5]);
    free(__ptr_00[uVar5]);
  }
  free(__ptr);
  free(__ptr_00);
  free(tally);
  free(width);
  free(pos);
  return;
}

Assistant:

void pack_table()
{
    register int i;
    register int place;
    register int state;

    base = NEW2(nvectors, Yshort);
    pos = NEW2(nentries, Yshort);

    maxtable = 1000;
    table = NEW2(maxtable, Yshort);
    check = NEW2(maxtable, Yshort);

    lowzero = 0;
    high = 0;

    for (i = 0; i < maxtable; i++)
	check[i] = -1;

    for (i = 0; i < nentries; i++)
    {
	state = matching_vector(i);

	if (state < 0)
	    place = pack_vector(i);
	else
	    place = base[state];

	pos[i] = place;
	base[order[i]] = place;
    }

    for (i = 0; i < nvectors; i++)
    {
	if (froms[i])
	    FREE(froms[i]);
	if (tos[i])
	    FREE(tos[i]);
    }

    FREE(froms);
    FREE(tos);
    FREE(tally);
    FREE(width);
    FREE(pos);
}